

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifsit(bifcxdef *ctx,int argc)

{
  runsdef **pprVar1;
  uchar uVar2;
  voccxdef *pvVar3;
  ushort *puVar4;
  objnum oVar5;
  errcxdef *peVar6;
  long lVar7;
  runcxdef *prVar8;
  runsdef *prVar9;
  int iVar10;
  uint local_2c;
  ushort *local_28;
  
  prVar8 = ctx->bifcxrun;
  pvVar3 = prVar8->runcxvoc;
  prVar9 = prVar8->runcxsp + -1;
  uVar2 = prVar8->runcxsp[-1].runstyp;
  if (argc == 2) {
    prVar8->runcxsp = prVar9;
    if (uVar2 == '\x05') {
      prVar8 = ctx->bifcxrun;
      prVar9 = prVar8->runcxsp;
      oVar5 = 0xffff;
    }
    else {
      prVar8 = ctx->bifcxrun;
      if (prVar9->runstyp != '\x02') {
        peVar6 = prVar8->runcxerr;
LAB_0020c690:
        peVar6->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3f2);
      }
      prVar9 = prVar8->runcxsp;
      oVar5 = (prVar9->runsv).runsvobj;
    }
    prVar8->runcxsp = prVar9 + -1;
    if (prVar9[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    iVar10 = *(int *)&ctx->bifcxrun->runcxsp->runsv;
    pvVar3->voccxthc = 0;
    if (iVar10 == 2) {
      pvVar3->voccxher = oVar5;
    }
    else if (iVar10 == 1) {
      pvVar3->voccxhim = oVar5;
    }
    else if (iVar10 == 0) {
      pvVar3->voccxit = oVar5;
    }
  }
  else {
    if (uVar2 == '\x05') {
      pvVar3->voccxit = 0xffff;
      pprVar1 = &ctx->bifcxrun->runcxsp;
      *pprVar1 = *pprVar1 + -1;
    }
    else {
      if (uVar2 == '\a') {
        prVar8->runcxsp = prVar9;
        if (prVar9->runstyp == '\a') {
          puVar4 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
          local_28 = puVar4 + 1;
          iVar10 = 0;
          local_2c = *puVar4 - 2;
          if (local_2c != 0) {
            do {
              if ((char)*local_28 == '\x02') {
                lVar7 = (long)iVar10;
                iVar10 = iVar10 + 1;
                pvVar3->voccxthm[lVar7] = *(objnum *)((long)local_28 + 1);
              }
              lstadv((uchar **)&local_28,&local_2c);
            } while (local_2c != 0);
          }
          pvVar3->voccxthc = (objnum)iVar10;
          pvVar3->voccxit = 0xffff;
          return;
        }
        ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3fc);
      }
      prVar8->runcxsp = prVar9;
      if (prVar9->runstyp != '\x02') {
        peVar6 = ctx->bifcxrun->runcxerr;
        goto LAB_0020c690;
      }
      pvVar3->voccxit = (ctx->bifcxrun->runcxsp->runsv).runsvobj;
    }
    pvVar3->voccxthc = 0;
  }
  return;
}

Assistant:

void bifsit(bifcxdef *ctx, int argc)
{
    objnum    obj;
    int       typ;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;
    
    /* check for extended version that allows setting him/her */
    if (argc == 2)
    {
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            rundisc(ctx->bifcxrun);                      /* discard the nil */
            obj = MCMONINV;                           /* use invalid object */
        }
        else
            obj = runpopobj(ctx->bifcxrun);               /* get the object */

        typ = runpopnum(ctx->bifcxrun);                     /* get the code */
        vcx->voccxthc = 0;                         /* clear the 'them' list */

        switch(typ)
        {
        case 0:                                                 /* set "it" */
            vcx->voccxit = obj;
            break;

        case 1:                                                /* set "him" */
            vcx->voccxhim = obj;
            break;

        case 2:                                                /* set "her" */
            vcx->voccxher = obj;
            break;
        }
        return;
    }

    /* "setit classic" has one argument only */
    bifcntargs(ctx, 1, argc);

    /* check to see if we're setting 'it' or 'them' */
    if (runtostyp(ctx->bifcxrun) == DAT_LIST)
    {
        uchar *lst;
        uint   siz;
        int    cnt;

        lst = runpoplst(ctx->bifcxrun);
        siz = osrp2(lst);
        lst += 2;
        siz -= 2;

        for (cnt = 0 ; siz ; )
        {
            /* if this is an object, add to 'them' list (otherwise ignore) */
            if (*lst == DAT_OBJECT)
                vcx->voccxthm[cnt++] = osrp2(lst+1);

            lstadv(&lst, &siz);
        }
        vcx->voccxthc = cnt;
        vcx->voccxit = MCMONINV;
    }
    else
    {
        /* set 'it', and delete 'them' list */
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            vcx->voccxit = MCMONINV;
            rundisc(ctx->bifcxrun);
        }
        else
            vcx->voccxit = runpopobj(ctx->bifcxrun);
        vcx->voccxthc = 0;
    }
}